

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void search_tx_type(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                   BLOCK_SIZE plane_bsize,TX_SIZE tx_size,TXB_CTX *txb_ctx,
                   FAST_TX_SEARCH_MODE ftxs_mode,int skip_trellis,int64_t ref_best_rd,
                   RD_STATS *best_rd_stats)

{
  uint uVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int64_t iVar9;
  int in_ECX;
  int in_EDX;
  long lVar10;
  long lVar11;
  int16_t *in_RSI;
  int16_t *in_RDI;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  MACROBLOCKD *in_stack_00000018;
  byte in_stack_00000020;
  uint in_stack_00000028;
  MACROBLOCK *in_stack_00000030;
  RD_STATS *in_stack_00000038;
  tran_low_t *tmp_dqcoeff;
  int64_t rd;
  int64_t tx_domain_dist;
  SCAN_ORDER *scan_order_1;
  int is_high_energy;
  int64_t high_energy_thresh;
  int64_t sse_diff;
  SCAN_ORDER *scan_order;
  RD_STATS this_rd_stats;
  TX_TYPE tx_type_1;
  int idx;
  int skip_trellis_based_on_satd [16];
  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  uint16_t *eobs_ptr;
  int calc_pixel_domain_distortion_final;
  int use_transform_domain_distortion;
  int perform_block_coeff_opt;
  uint16_t allowed_tx_mask;
  uint16_t tx_mask;
  TX_TYPE tx_type;
  int64_t per_px_mean;
  _Bool predict_dc_block;
  int dc_only_blk;
  uint block_mse_q8;
  int64_t block_sse;
  uint8_t txh;
  uint8_t txw;
  int qstep;
  int dequant_shift;
  int txk_map [16];
  TX_TYPE txk_allowed;
  uint8_t best_txb_ctx;
  int tx_type_map_idx;
  tran_low_t *best_dqcoeff;
  tran_low_t *orig_dqcoeff;
  macroblock_plane *p;
  int rate_cost;
  TX_TYPE best_tx_type;
  uint16_t best_eob;
  int64_t best_rd;
  TxfmSearchParams *txfm_params;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int in_stack_00001e18;
  int in_stack_00001e1c;
  BLOCK_SIZE in_stack_00001e23;
  int in_stack_00001e24;
  MACROBLOCK *in_stack_00001e28;
  AV1_COMP *in_stack_00001e30;
  int in_stack_00001e40;
  TX_SIZE in_stack_00001e48;
  undefined8 in_stack_fffffffffffffd98;
  undefined4 uVar12;
  MACROBLOCKD *qparam;
  RD_STATS *in_stack_fffffffffffffda0;
  undefined4 uVar13;
  MACROBLOCKD *in_stack_fffffffffffffda8;
  undefined4 uVar14;
  CommonQuantParams *in_stack_fffffffffffffdb0;
  undefined4 uVar15;
  MACROBLOCK *in_stack_fffffffffffffdb8;
  MACROBLOCK *in_stack_fffffffffffffdc0;
  undefined1 *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined5 in_stack_fffffffffffffdd8;
  undefined1 uVar16;
  byte bVar17;
  undefined1 uVar18;
  undefined2 uVar19;
  TX_TYPE tx_type_00;
  TX_SIZE tx_size_00;
  QUANT_PARAM *in_stack_fffffffffffffde8;
  MACROBLOCK *in_stack_fffffffffffffdf0;
  AV1_COMP *in_stack_fffffffffffffdf8;
  AV1_COMP *pAVar20;
  MACROBLOCK *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  TXB_CTX *in_stack_fffffffffffffe10;
  MACROBLOCK *in_stack_fffffffffffffe18;
  AV1_COMP *in_stack_fffffffffffffe20;
  int local_1d8 [2];
  BLOCK_SIZE plane_bsize_00;
  AV1_COMP *in_stack_fffffffffffffe30;
  TX_SIZE in_stack_fffffffffffffe38;
  AV1_COMP *in_stack_fffffffffffffe40;
  AV1_COMP *pAVar21;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  TX_TYPE in_stack_fffffffffffffe50;
  TX_SIZE in_stack_fffffffffffffe52;
  BLOCK_SIZE in_stack_fffffffffffffe53;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  int *in_stack_fffffffffffffe60;
  uint16_t in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  MACROBLOCK *in_stack_fffffffffffffe88;
  AV1_COMP *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffe98;
  int local_14c;
  byte local_140;
  BLOCK_SIZE in_stack_fffffffffffffed0;
  TX_SIZE in_stack_fffffffffffffed8;
  long lVar22;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  uint uVar23;
  FAST_TX_SEARCH_MODE in_stack_fffffffffffffee8;
  uint uVar24;
  undefined2 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef2;
  undefined2 in_stack_fffffffffffffef4;
  uint16_t mask;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  int16_t *allowed_txk_types;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 local_f8 [4];
  undefined1 local_f4 [4];
  undefined1 local_f0 [99];
  undefined1 local_8d;
  int16_t local_8c [2];
  QUANT_PARAM *local_88;
  int16_t *local_80;
  tran_low_t *local_78;
  undefined1 local_70 [40];
  int16_t *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int16_t *local_30;
  int16_t *local_28;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_48 = in_RDI + 0x1dfc0;
  local_70._32_8_ = in_RSI + 0xd0;
  local_70._24_8_ = **(long **)(in_RSI + 0x102c);
  local_70._16_8_ = in_RSI + 0x126e6;
  local_70._8_8_ = (MACROBLOCK *)0x7fffffffffffffff;
  local_70._6_2_ = 0;
  local_70[5] = 0;
  local_70._0_4_ = 0;
  local_78 = (tran_low_t *)(in_RSI + (long)in_EDX * 0x44);
  local_80 = *(int16_t **)(local_78 + 2);
  local_88 = *(QUANT_PARAM **)(in_RSI + 0x12b1c);
  if (in_EDX == 0) {
    iVar4 = in_R8D * *(int *)(in_RSI + 0x1048) + in_R9D;
    uVar19 = (undefined2)iVar4;
    tx_type_00 = (TX_TYPE)((uint)iVar4 >> 0x10);
    tx_size_00 = (TX_SIZE)((uint)iVar4 >> 0x18);
  }
  else {
    uVar19 = 0;
    tx_type_00 = '\0';
    tx_size_00 = '\0';
  }
  local_8c[1]._0_1_ = tx_type_00;
  local_8c[0] = uVar19;
  local_8c[1]._1_1_ = tx_size_00;
  local_40 = in_R9D;
  local_3c = in_R8D;
  local_38 = in_ECX;
  local_34 = in_EDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  av1_invalid_rd_stats(in_stack_00000038);
  iVar4 = is_trellis_used(*(TRELLIS_OPT_TYPE *)
                           ((long)local_28 +
                           (ulong)((byte)*(undefined2 *)
                                          &(**(MB_MODE_INFO ***)(local_70._32_8_ + 0x1eb8))->
                                           field_0xa7 & 7) + 0x427a0),'\x01');
  local_8d = 0;
  local_f0[0x62] = 0x10;
  memcpy(local_f0 + 0x18,&DAT_01a16aa0,0x40);
  iVar5 = is_cur_buf_hbd((MACROBLOCKD *)local_70._32_8_);
  if (iVar5 == 0) {
    iVar5 = 3;
  }
  else {
    iVar5 = *(int *)(local_70._32_8_ + 0x29a0) + -5;
  }
  local_f0._16_4_ =
       (int)*(short *)(*(long *)(local_30 + (long)local_34 * 0x44 + 0x40) + 2) >>
       ((byte)iVar5 & 0x1f);
  local_f0[0xf] = (char)tx_size_wide[in_stack_00000010];
  local_f0[0xe] = (char)tx_size_high[in_stack_00000010];
  local_f8 = (undefined1  [4])0x0;
  uVar18 = false;
  if ((*(int *)(local_70._16_8_ + 0x28) != 0) && (uVar18 = false, local_f0[0xf] != '@')) {
    uVar18 = local_f0[0xe] != '@';
  }
  allowed_txk_types = (int16_t *)0x7fffffffffffffff;
  uVar16 = uVar18;
  local_f0._20_4_ = iVar5;
  if ((bool)uVar18 == false) {
    qparam = (MACROBLOCKD *)local_f4;
    local_f0._0_8_ =
         av1_pixel_diff_dist(in_stack_fffffffffffffe00,
                             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                             (int)in_stack_fffffffffffffdf8,
                             (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                             (BLOCK_SIZE)((ulong)in_stack_fffffffffffffdf0 >> 0x18),
                             (BLOCK_SIZE)((ulong)in_stack_fffffffffffffdf0 >> 0x10),
                             (uint *)in_stack_fffffffffffffe10);
  }
  else {
    in_stack_fffffffffffffda8 = (MACROBLOCKD *)local_f0;
    in_stack_fffffffffffffdb0 = (CommonQuantParams *)local_f4;
    in_stack_fffffffffffffdb8 = (MACROBLOCK *)&stack0xfffffffffffffef8;
    in_stack_fffffffffffffdc0 = (MACROBLOCK *)local_f8;
    qparam = (MACROBLOCKD *)CONCAT44(uVar12,local_40);
    in_stack_fffffffffffffda0 = in_stack_00000038;
    predict_dc_only_block
              ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe53,in_stack_fffffffffffffe52,
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,in_stack_fffffffffffffe70,
               (RD_STATS *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (int64_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (uint *)in_stack_fffffffffffffe88,(int64_t *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe98);
    if (in_stack_00000038->skip_txfm == '\x01') {
      if (local_34 != 0) {
        return;
      }
      (*(uint8_t **)(local_70._32_8_ + 0x1ee8))[(int)local_8c] = '\0';
      return;
    }
  }
  if ((local_f8 == (undefined1  [4])0x0) && (*(int *)(local_28 + 0x306d2) != 1)) {
    in_stack_fffffffffffffdc8 = local_f0 + 0x18;
    in_stack_fffffffffffffdc0 = (MACROBLOCK *)(local_f0 + 0x62);
    qparam = (MACROBLOCKD *)CONCAT44((int)((ulong)qparam >> 0x20),(uint)in_stack_00000008);
    in_stack_fffffffffffffda0 =
         (RD_STATS *)
         CONCAT44((int)((ulong)in_stack_fffffffffffffda0 >> 0x20),(uint)in_stack_00000010);
    in_stack_fffffffffffffdb0 =
         (CommonQuantParams *)
         CONCAT44((int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(uint)in_stack_00000020);
    in_stack_fffffffffffffda8 = in_stack_00000018;
    in_stack_fffffffffffffdb8 = in_stack_00000030;
    mask = get_tx_mask(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84
                       ,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                       in_stack_fffffffffffffe78,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8
                       ,(TXB_CTX *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffee8,
                       CONCAT17(in_stack_fffffffffffffef7,
                                CONCAT16(in_stack_fffffffffffffef6,
                                         CONCAT24(in_stack_fffffffffffffef4,
                                                  CONCAT22(in_stack_fffffffffffffef2,
                                                           in_stack_fffffffffffffef0)))),
                       (TX_TYPE *)allowed_txk_types,
                       (int *)CONCAT17(uVar16,in_stack_ffffffffffffff00));
  }
  else {
    mask = 1;
  }
  iVar6 = is_cur_buf_hbd((MACROBLOCKD *)local_70._32_8_);
  if (iVar6 != 0) {
    local_f0._0_8_ =
         local_f0._0_8_ +
         (long)((1 << (((char)*(int *)(local_70._32_8_ + 0x29a0) + -8) * '\x02' & 0x1fU)) >> 1) >>
         (((char)*(int *)(local_70._32_8_ + 0x29a0) + -8) * '\x02' & 0x3fU);
    local_f4 = (undefined1  [4])
               ((uint)((int)local_f4 +
                      ((1 << (((char)*(int *)(local_70._32_8_ + 0x29a0) + -8) * '\x02' & 0x1fU)) >>
                      1)) >> (((char)*(int *)(local_70._32_8_ + 0x29a0) + -8) * '\x02' & 0x1fU));
  }
  local_f0._0_8_ = local_f0._0_8_ << 4;
  uVar8 = (ulong)(uint)local_f4;
  uVar1 = *(uint *)(local_70._16_8_ + 0xc);
  lVar10 = (long)(int)local_f0._16_4_;
  lVar11 = (long)(int)local_f0._16_4_;
  bVar17 = 0;
  if (((*(int *)(local_70._16_8_ + 0x1c) != 0) &&
      (bVar17 = 0, *(uint *)(local_70._16_8_ + 0x14) <= (uint)local_f4)) &&
     (bVar17 = 0, ""[in_stack_00000010] != '\x04')) {
    bVar17 = local_f8 != (undefined1  [4])0x0 ^ 0xff;
  }
  uVar24 = (uint)(bVar17 & 1);
  uVar16 = false;
  if ((*(int *)(local_70._16_8_ + 0x1c) == 1) && (uVar16 = false, uVar24 != 0)) {
    uVar16 = (qm_val_t)local_30[0xe31e] != '\x01';
  }
  uVar23 = (uint)(byte)uVar16;
  if ((uVar23 != 0) && ((local_f0[0x62] < 0x10 || (mask == 1)))) {
    uVar24 = 0;
    uVar23 = 0;
  }
  lVar22 = *(long *)(local_30 + (long)local_34 * 0x44 + 0x10);
  memset(&stack0xfffffffffffffe58,0,0x40);
  av1_setup_xform((AV1_COMMON *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                  (TX_SIZE)((ulong)in_stack_fffffffffffffdb0 >> 0x38),
                  (TX_TYPE)((ulong)in_stack_fffffffffffffdb0 >> 0x30),
                  (TxfmParam *)in_stack_fffffffffffffda8);
  av1_setup_quant((TX_SIZE)((ulong)in_stack_fffffffffffffda0 >> 0x38),(int)in_stack_fffffffffffffda0
                  ,(int)((ulong)qparam >> 0x20),(int)qparam,(QUANT_PARAM *)0x13937dc);
  for (iVar6 = 0; iVar6 < 0x10; iVar6 = iVar6 + 1) {
    bVar2 = (byte)*(uint *)(local_f0 + (long)iVar6 * 4 + 0x18);
    pAVar20 = in_stack_fffffffffffffe30;
    pAVar21 = in_stack_fffffffffffffe40;
    if ((bVar2 != 0xff) &&
       (_Var3 = check_bit_mask(mask,*(uint *)(local_f0 + (long)iVar6 * 4 + 0x18) & 0xff),
       pAVar20 = in_stack_fffffffffffffe30, pAVar21 = in_stack_fffffffffffffe40, _Var3)) {
      local_140 = bVar2;
      _Var3 = av1_use_qmatrix((CommonQuantParams *)(local_48 + 0x134),(macroblockd *)local_70._32_8_
                              ,(uint)((byte)*(undefined2 *)(local_70._24_8_ + 0xa7) & 7));
      pAVar20 = in_stack_fffffffffffffe30;
      pAVar21 = in_stack_fffffffffffffe40;
      if (_Var3) {
        av1_setup_qmatrix(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                          (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                          (TX_SIZE)((ulong)in_stack_fffffffffffffda0 >> 0x18),
                          (TX_TYPE)((ulong)in_stack_fffffffffffffda0 >> 0x10),(QUANT_PARAM *)qparam)
        ;
        pAVar20 = in_stack_fffffffffffffe30;
        pAVar21 = in_stack_fffffffffffffe40;
      }
      uVar12 = (undefined4)((ulong)qparam >> 0x20);
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
      uVar14 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      uVar13 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
      if (local_34 == 0) {
        (*(uint8_t **)(local_70._32_8_ + 0x1ee8))[(int)local_8c] = bVar2;
      }
      av1_invalid_rd_stats((RD_STATS *)local_1d8);
      iVar7 = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
      if (local_f8 == (undefined1  [4])0x0) {
        uVar12 = (undefined4)((ulong)&stack0xfffffffffffffec0 >> 0x20);
        av1_xform((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),iVar7,
                  (int)in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                  (int)in_stack_fffffffffffffdc0,
                  (BLOCK_SIZE)((ulong)in_stack_fffffffffffffdb8 >> 0x38),
                  (TxfmParam *)CONCAT17(tx_size_00,CONCAT16(tx_type_00,CONCAT24(uVar19,iVar5))));
      }
      else {
        av1_xform_dc_only((MACROBLOCK *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),iVar7,
                          (int)in_stack_fffffffffffffdc8,(TxfmParam *)in_stack_fffffffffffffdc0,
                          (int64_t)in_stack_fffffffffffffdb8);
      }
      in_stack_fffffffffffffda0 =
           (RD_STATS *)CONCAT44(uVar13,*(undefined4 *)(local_70._16_8_ + 0x10));
      in_stack_fffffffffffffda8 =
           (MACROBLOCKD *)
           CONCAT44(uVar14,(uint)((uVar8 <= (ulong)uVar1 * lVar10 * lVar11 ^ 0xffU) & 1) |
                           (iVar4 != 0 ^ 0xffU) & 1 | in_stack_00000028);
      in_stack_fffffffffffffdb0 = (CommonQuantParams *)CONCAT44(uVar15,local_f8);
      iVar7 = skip_trellis_opt_based_on_satd
                        ((MACROBLOCK *)
                         CONCAT17(uVar18,CONCAT16(bVar17,CONCAT15(uVar16,in_stack_fffffffffffffdd8))
                                 ),
                         (QUANT_PARAM *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                         (int)in_stack_fffffffffffffdc8,
                         (TX_SIZE)((ulong)in_stack_fffffffffffffdc0 >> 0x38),
                         (int)in_stack_fffffffffffffdc0,(int)in_stack_fffffffffffffdf0,
                         (uint)in_stack_fffffffffffffdf8,(int)in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffe08);
      *(int *)(&stack0xfffffffffffffe58 + (ulong)bVar2 * 4) = iVar7;
      av1_quant(in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                (int)in_stack_fffffffffffffdf8,(TxfmParam *)in_stack_fffffffffffffdf0,
                in_stack_fffffffffffffde8);
      if (local_14c == 0) {
        qparam = (MACROBLOCKD *)CONCAT44(uVar12,(uint)(*(byte *)((long)local_48 + 0x1f5) & 1));
        local_70._0_4_ =
             cost_coeffs(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                         (int)in_stack_fffffffffffffdb8,
                         (TX_SIZE)((ulong)in_stack_fffffffffffffdb0 >> 0x38),
                         (TX_TYPE)((ulong)in_stack_fffffffffffffdb0 >> 0x30),
                         (TXB_CTX *)in_stack_fffffffffffffda8,in_stack_fffffffffffffdd0);
      }
      else {
        in_stack_fffffffffffffda0 = (RD_STATS *)local_70;
        qparam = in_stack_00000018;
        av1_optimize_b(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                       (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                       (int)in_stack_fffffffffffffde8,tx_size_00,tx_type_00,
                       in_stack_fffffffffffffe10,(int *)in_stack_fffffffffffffe18);
      }
      if ((long)(int)local_70._0_4_ * (long)*(int *)(local_30 + 0x210c) + 0x100 >> 9 <=
          (long)local_70._8_8_) {
        in_stack_fffffffffffffe30 = (AV1_COMP *)local_f0._0_8_;
        in_stack_fffffffffffffe40 = (AV1_COMP *)local_f0._0_8_;
        if (*(short *)(lVar22 + (long)local_38 * 2) != 0) {
          if (local_f8 == (undefined1  [4])0x0) {
            if (uVar24 == 0) {
              in_stack_fffffffffffffe18 = (MACROBLOCK *)0x7fffffffffffffff;
              in_stack_fffffffffffffe10 = (TXB_CTX *)((long)tx_size_2d[in_stack_00000010] << 0xe);
              in_stack_fffffffffffffe0c =
                   (uint)((long)in_stack_fffffffffffffe10 <= (long)local_f0._0_8_);
              if ((in_stack_00000010 == 4) || (in_stack_fffffffffffffe0c != 0)) {
                in_stack_fffffffffffffe00 = (MACROBLOCK *)get_scan('\0','\0');
                qparam = (MACROBLOCKD *)&stack0xfffffffffffffe30;
                in_stack_fffffffffffffda0 = (RD_STATS *)&stack0xfffffffffffffe40;
                dist_block_tx_domain
                          (in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20)
                           ,(int)in_stack_fffffffffffffdf8,
                           (TX_SIZE)((ulong)in_stack_fffffffffffffdf0 >> 0x38),
                           (qm_val_t *)in_stack_fffffffffffffde8,
                           (int16_t *)
                           CONCAT17(tx_size_00,CONCAT16(tx_type_00,CONCAT24(uVar19,iVar5))),
                           (int64_t *)in_stack_fffffffffffffe10,(int64_t *)in_stack_fffffffffffffe18
                          );
                in_stack_fffffffffffffe18 = (MACROBLOCK *)(local_f0._0_8_ - (long)pAVar21);
              }
              if (((in_stack_00000010 == 4) && (in_stack_fffffffffffffe0c != 0)) &&
                 ((long)pAVar21 <= (long)in_stack_fffffffffffffe18 * 2)) {
                in_stack_fffffffffffffe30 =
                     (AV1_COMP *)
                     ((long)(pAVar20->enc_quant_dequant_params).quants.y_quant[0] +
                     (long)((long)(in_stack_fffffffffffffe18->plane + -1) + 0x78));
                in_stack_fffffffffffffe40 = (AV1_COMP *)local_f0._0_8_;
              }
              else {
                qparam = (MACROBLOCKD *)CONCAT44((int)((ulong)qparam >> 0x20),local_40);
                in_stack_fffffffffffffda0 =
                     (RD_STATS *)((ulong)in_stack_fffffffffffffda0 & 0xffffffff00000000);
                in_stack_fffffffffffffe30 =
                     (AV1_COMP *)
                     dist_block_px_domain
                               (in_stack_00001e30,in_stack_00001e28,in_stack_00001e24,
                                in_stack_00001e23,in_stack_00001e1c,in_stack_00001e18,
                                in_stack_00001e40,in_stack_00001e48);
                in_stack_fffffffffffffdf8 = pAVar20;
                in_stack_fffffffffffffe40 = (AV1_COMP *)local_f0._0_8_;
                if ((in_stack_fffffffffffffe0c != 0) &&
                   ((long)in_stack_fffffffffffffe30 < (long)pAVar20)) {
                  in_stack_fffffffffffffe30 = pAVar20;
                }
              }
            }
            else {
              in_stack_fffffffffffffe20 = (AV1_COMP *)get_scan('\0','\0');
              qparam = (MACROBLOCKD *)&stack0xfffffffffffffe30;
              in_stack_fffffffffffffda0 = (RD_STATS *)&stack0xfffffffffffffe40;
              dist_block_tx_domain
                        (in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                         (int)in_stack_fffffffffffffdf8,
                         (TX_SIZE)((ulong)in_stack_fffffffffffffdf0 >> 0x38),
                         (qm_val_t *)in_stack_fffffffffffffde8,
                         (int16_t *)CONCAT17(tx_size_00,CONCAT16(tx_type_00,CONCAT24(uVar19,iVar5)))
                         ,(int64_t *)in_stack_fffffffffffffe10,(int64_t *)in_stack_fffffffffffffe18)
              ;
              in_stack_fffffffffffffe30 = pAVar20;
              in_stack_fffffffffffffe40 = pAVar21;
            }
          }
          else {
            qparam = (MACROBLOCKD *)CONCAT44((int)((ulong)qparam >> 0x20),local_40);
            in_stack_fffffffffffffda0 =
                 (RD_STATS *)((ulong)in_stack_fffffffffffffda0 & 0xffffffff00000000);
            in_stack_fffffffffffffe30 =
                 (AV1_COMP *)
                 dist_block_px_domain
                           (in_stack_00001e30,in_stack_00001e28,in_stack_00001e24,in_stack_00001e23,
                            in_stack_00001e1c,in_stack_00001e18,in_stack_00001e40,in_stack_00001e48)
            ;
          }
        }
        local_1d8[0] = local_70._0_4_;
        in_stack_fffffffffffffdf0 =
             (MACROBLOCK *)
             (((long)(int)local_70._0_4_ * (long)*(int *)(local_30 + 0x210c) + 0x100 >> 9) +
             (long)in_stack_fffffffffffffe30 * 0x80);
        if ((long)in_stack_fffffffffffffdf0 < (long)local_70._8_8_) {
          local_70._8_8_ = in_stack_fffffffffffffdf0;
          memcpy(in_stack_00000038,local_1d8,0x28);
          in_stack_fffffffffffffde8 = local_88;
          local_70[5] = bVar2;
          local_8d = *(undefined1 *)
                      (*(long *)(local_30 + (long)local_34 * 0x44 + 0x14) + (long)local_38);
          local_70._6_2_ =
               *(short *)(*(long *)(local_30 + (long)local_34 * 0x44 + 0x10) + (long)local_38 * 2);
          local_88 = *(QUANT_PARAM **)(local_78 + 2);
          *(QUANT_PARAM **)(local_78 + 2) = in_stack_fffffffffffffde8;
        }
        if (((*(int *)(local_28 + 0x30602) != 0) &&
            ((long)in_stack_00000030 <
             local_70._8_8_ -
             ((long)local_70._8_8_ >> ((byte)*(undefined4 *)(local_28 + 0x30602) & 0x3f)))) ||
           ((pAVar20 = in_stack_fffffffffffffe30, pAVar21 = in_stack_fffffffffffffe40,
            *(int *)(local_28 + 0x305f8) != 0 && (local_70._6_2_ == 0)))) break;
      }
    }
    in_stack_fffffffffffffe30 = pAVar20;
    in_stack_fffffffffffffe40 = pAVar21;
  }
  plane_bsize_00 = (BLOCK_SIZE)in_stack_fffffffffffffe30;
  in_stack_00000038->skip_txfm = local_70._6_2_ == 0;
  if (local_34 == 0) {
    update_txk_array((MACROBLOCKD *)local_70._32_8_,local_3c,local_40,in_stack_00000010,local_70[5])
    ;
  }
  *(undefined1 *)(*(long *)(local_30 + (long)local_34 * 0x44 + 0x14) + (long)local_38) = local_8d;
  *(undefined2 *)(*(long *)(local_30 + (long)local_34 * 0x44 + 0x10) + (long)local_38 * 2) =
       local_70._6_2_;
  *(QUANT_PARAM **)(local_78 + 2) = local_88;
  if ((uVar23 != 0) && (local_70._6_2_ != 0)) {
    iVar9 = dist_block_px_domain
                      (in_stack_00001e30,in_stack_00001e28,in_stack_00001e24,in_stack_00001e23,
                       in_stack_00001e1c,in_stack_00001e18,in_stack_00001e40,in_stack_00001e48);
    in_stack_00000038->dist = iVar9;
    in_stack_00000038->sse = local_f0._0_8_;
  }
  recon_intra(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
              (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),(int)in_stack_fffffffffffffe10,
              in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,plane_bsize_00,
              in_stack_fffffffffffffe38,(TXB_CTX *)in_stack_fffffffffffffe40,
              in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
              in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  *(int16_t **)(local_78 + 2) = local_80;
  return;
}

Assistant:

static void search_tx_type(const AV1_COMP *cpi, MACROBLOCK *x, int plane,
                           int block, int blk_row, int blk_col,
                           BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                           const TXB_CTX *const txb_ctx,
                           FAST_TX_SEARCH_MODE ftxs_mode, int skip_trellis,
                           int64_t ref_best_rd, RD_STATS *best_rd_stats) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  int64_t best_rd = INT64_MAX;
  uint16_t best_eob = 0;
  TX_TYPE best_tx_type = DCT_DCT;
  int rate_cost = 0;
  struct macroblock_plane *const p = &x->plane[plane];
  tran_low_t *orig_dqcoeff = p->dqcoeff;
  tran_low_t *best_dqcoeff = x->dqcoeff_buf;
  const int tx_type_map_idx =
      plane ? 0 : blk_row * xd->tx_type_map_stride + blk_col;
  av1_invalid_rd_stats(best_rd_stats);

  skip_trellis |= !is_trellis_used(cpi->optimize_seg_arr[xd->mi[0]->segment_id],
                                   DRY_RUN_NORMAL);

  uint8_t best_txb_ctx = 0;
  // txk_allowed = TX_TYPES: >1 tx types are allowed
  // txk_allowed < TX_TYPES: only that specific tx type is allowed.
  TX_TYPE txk_allowed = TX_TYPES;
  int txk_map[TX_TYPES] = {
    0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15
  };
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;
  const int qstep = x->plane[plane].dequant_QTX[1] >> dequant_shift;

  const uint8_t txw = tx_size_wide[tx_size];
  const uint8_t txh = tx_size_high[tx_size];
  int64_t block_sse;
  unsigned int block_mse_q8;
  int dc_only_blk = 0;
  const bool predict_dc_block =
      txfm_params->predict_dc_level >= 1 && txw != 64 && txh != 64;
  int64_t per_px_mean = INT64_MAX;
  if (predict_dc_block) {
    predict_dc_only_block(x, plane, plane_bsize, tx_size, block, blk_row,
                          blk_col, best_rd_stats, &block_sse, &block_mse_q8,
                          &per_px_mean, &dc_only_blk);
    if (best_rd_stats->skip_txfm == 1) {
      const TX_TYPE tx_type = DCT_DCT;
      if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
      return;
    }
  } else {
    block_sse = av1_pixel_diff_dist(x, plane, blk_row, blk_col, plane_bsize,
                                    txsize_to_bsize[tx_size], &block_mse_q8);
    assert(block_mse_q8 != UINT_MAX);
  }

  // Bit mask to indicate which transform types are allowed in the RD search.
  uint16_t tx_mask;

  // Use DCT_DCT transform for DC only block.
  if (dc_only_blk || cpi->sf.rt_sf.dct_only_palette_nonrd == 1)
    tx_mask = 1 << DCT_DCT;
  else
    tx_mask = get_tx_mask(cpi, x, plane, block, blk_row, blk_col, plane_bsize,
                          tx_size, txb_ctx, ftxs_mode, ref_best_rd,
                          &txk_allowed, txk_map);
  const uint16_t allowed_tx_mask = tx_mask;

  if (is_cur_buf_hbd(xd)) {
    block_sse = ROUND_POWER_OF_TWO(block_sse, (xd->bd - 8) * 2);
    block_mse_q8 = ROUND_POWER_OF_TWO(block_mse_q8, (xd->bd - 8) * 2);
  }
  block_sse *= 16;
  // Use mse / qstep^2 based threshold logic to take decision of R-D
  // optimization of coeffs. For smaller residuals, coeff optimization
  // would be helpful. For larger residuals, R-D optimization may not be
  // effective.
  // TODO(any): Experiment with variance and mean based thresholds
  const int perform_block_coeff_opt =
      ((uint64_t)block_mse_q8 <=
       (uint64_t)txfm_params->coeff_opt_thresholds[0] * qstep * qstep);
  skip_trellis |= !perform_block_coeff_opt;

  // Flag to indicate if distortion should be calculated in transform domain or
  // not during iterating through transform type candidates.
  // Transform domain distortion is accurate for higher residuals.
  // TODO(any): Experiment with variance and mean based thresholds
  int use_transform_domain_distortion =
      (txfm_params->use_transform_domain_distortion > 0) &&
      (block_mse_q8 >= txfm_params->tx_domain_dist_threshold) &&
      // Any 64-pt transforms only preserves half the coefficients.
      // Therefore transform domain distortion is not valid for these
      // transform sizes.
      (txsize_sqr_up_map[tx_size] != TX_64X64) &&
      // Use pixel domain distortion for DC only blocks
      !dc_only_blk;
  // Flag to indicate if an extra calculation of distortion in the pixel domain
  // should be performed at the end, after the best transform type has been
  // decided.
  int calc_pixel_domain_distortion_final =
      txfm_params->use_transform_domain_distortion == 1 &&
      use_transform_domain_distortion && x->rd_model != LOW_TXFM_RD;
  if (calc_pixel_domain_distortion_final &&
      (txk_allowed < TX_TYPES || allowed_tx_mask == 0x0001))
    calc_pixel_domain_distortion_final = use_transform_domain_distortion = 0;

  const uint16_t *eobs_ptr = x->plane[plane].eobs;

  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  int skip_trellis_based_on_satd[TX_TYPES] = { 0 };
  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, !skip_trellis,
                  skip_trellis ? (USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B
                                                         : AV1_XFORM_QUANT_FP)
                               : AV1_XFORM_QUANT_FP,
                  cpi->oxcf.q_cfg.quant_b_adapt, &quant_param);

  // Iterate through all transform type candidates.
  for (int idx = 0; idx < TX_TYPES; ++idx) {
    const TX_TYPE tx_type = (TX_TYPE)txk_map[idx];
    if (tx_type == TX_TYPE_INVALID || !check_bit_mask(allowed_tx_mask, tx_type))
      continue;
    txfm_param.tx_type = tx_type;
    if (av1_use_qmatrix(&cm->quant_params, xd, mbmi->segment_id)) {
      av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                        &quant_param);
    }
    if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
    RD_STATS this_rd_stats;
    av1_invalid_rd_stats(&this_rd_stats);

    if (!dc_only_blk)
      av1_xform(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param);
    else
      av1_xform_dc_only(x, plane, block, &txfm_param, per_px_mean);

    skip_trellis_based_on_satd[tx_type] = skip_trellis_opt_based_on_satd(
        x, &quant_param, plane, block, tx_size, cpi->oxcf.q_cfg.quant_b_adapt,
        qstep, txfm_params->coeff_opt_thresholds[1], skip_trellis, dc_only_blk);

    av1_quant(x, plane, block, &txfm_param, &quant_param);

    // Calculate rate cost of quantized coefficients.
    if (quant_param.use_optimize_b) {
      // TODO(aomedia:3209): update Trellis quantization to take into account
      // quantization matrices.
      av1_optimize_b(cpi, x, plane, block, tx_size, tx_type, txb_ctx,
                     &rate_cost);
    } else {
      rate_cost = cost_coeffs(x, plane, block, tx_size, tx_type, txb_ctx,
                              cm->features.reduced_tx_set_used);
    }

    // If rd cost based on coeff rate alone is already more than best_rd,
    // terminate early.
    if (RDCOST(x->rdmult, rate_cost, 0) > best_rd) continue;

    // Calculate distortion.
    if (eobs_ptr[block] == 0) {
      // When eob is 0, pixel domain distortion is more efficient and accurate.
      this_rd_stats.dist = this_rd_stats.sse = block_sse;
    } else if (dc_only_blk) {
      this_rd_stats.sse = block_sse;
      this_rd_stats.dist = dist_block_px_domain(
          cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    } else if (use_transform_domain_distortion) {
      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);
    } else {
      int64_t sse_diff = INT64_MAX;
      // high_energy threshold assumes that every pixel within a txfm block
      // has a residue energy of at least 25% of the maximum, i.e. 128 * 128
      // for 8 bit.
      const int64_t high_energy_thresh =
          ((int64_t)128 * 128 * tx_size_2d[tx_size]);
      const int is_high_energy = (block_sse >= high_energy_thresh);
      if (tx_size == TX_64X64 || is_high_energy) {
        // Because 3 out 4 quadrants of transform coefficients are forced to
        // zero, the inverse transform has a tendency to overflow. sse_diff
        // is effectively the energy of those 3 quadrants, here we use it
        // to decide if we should do pixel domain distortion. If the energy
        // is mostly in first quadrant, then it is unlikely that we have
        // overflow issue in inverse transform.
        const SCAN_ORDER *const scan_order =
            get_scan(txfm_param.tx_size, txfm_param.tx_type);
        dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                             scan_order->scan, &this_rd_stats.dist,
                             &this_rd_stats.sse);
        sse_diff = block_sse - this_rd_stats.sse;
      }
      if (tx_size != TX_64X64 || !is_high_energy ||
          (sse_diff * 2) < this_rd_stats.sse) {
        const int64_t tx_domain_dist = this_rd_stats.dist;
        this_rd_stats.dist = dist_block_px_domain(
            cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
        // For high energy blocks, occasionally, the pixel domain distortion
        // can be artificially low due to clamping at reconstruction stage
        // even when inverse transform output is hugely different from the
        // actual residue.
        if (is_high_energy && this_rd_stats.dist < tx_domain_dist)
          this_rd_stats.dist = tx_domain_dist;
      } else {
        assert(sse_diff < INT64_MAX);
        this_rd_stats.dist += sse_diff;
      }
      this_rd_stats.sse = block_sse;
    }

    this_rd_stats.rate = rate_cost;

    const int64_t rd =
        RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);

    if (rd < best_rd) {
      best_rd = rd;
      *best_rd_stats = this_rd_stats;
      best_tx_type = tx_type;
      best_txb_ctx = x->plane[plane].txb_entropy_ctx[block];
      best_eob = x->plane[plane].eobs[block];
      // Swap dqcoeff buffers
      tran_low_t *const tmp_dqcoeff = best_dqcoeff;
      best_dqcoeff = p->dqcoeff;
      p->dqcoeff = tmp_dqcoeff;
    }

#if CONFIG_COLLECT_RD_STATS == 1
    if (plane == 0) {
      PrintTransformUnitStats(cpi, x, &this_rd_stats, blk_row, blk_col,
                              plane_bsize, tx_size, tx_type, rd);
    }
#endif  // CONFIG_COLLECT_RD_STATS == 1

#if COLLECT_TX_SIZE_DATA
    // Generate small sample to restrict output size.
    static unsigned int seed = 21743;
    if (lcg_rand16(&seed) % 200 == 0) {
      FILE *fp = NULL;

      if (within_border) {
        fp = fopen(av1_tx_size_data_output_file, "a");
      }

      if (fp) {
        // Transform info and RD
        const int txb_w = tx_size_wide[tx_size];
        const int txb_h = tx_size_high[tx_size];

        // Residue signal.
        const int diff_stride = block_size_wide[plane_bsize];
        struct macroblock_plane *const p = &x->plane[plane];
        const int16_t *src_diff =
            &p->src_diff[(blk_row * diff_stride + blk_col) * 4];

        for (int r = 0; r < txb_h; ++r) {
          for (int c = 0; c < txb_w; ++c) {
            fprintf(fp, "%d,", src_diff[c]);
          }
          src_diff += diff_stride;
        }

        fprintf(fp, "%d,%d,%d,%" PRId64, txb_w, txb_h, tx_type, rd);
        fprintf(fp, "\n");
        fclose(fp);
      }
    }
#endif  // COLLECT_TX_SIZE_DATA

    // If the current best RD cost is much worse than the reference RD cost,
    // terminate early.
    if (cpi->sf.tx_sf.adaptive_txb_search_level) {
      if ((best_rd - (best_rd >> cpi->sf.tx_sf.adaptive_txb_search_level)) >
          ref_best_rd) {
        break;
      }
    }

    // Terminate transform type search if the block has been quantized to
    // all zero.
    if (cpi->sf.tx_sf.tx_type_search.skip_tx_search && !best_eob) break;
  }

  assert(best_rd != INT64_MAX);

  best_rd_stats->skip_txfm = best_eob == 0;
  if (plane == 0) update_txk_array(xd, blk_row, blk_col, tx_size, best_tx_type);
  x->plane[plane].txb_entropy_ctx[block] = best_txb_ctx;
  x->plane[plane].eobs[block] = best_eob;
  skip_trellis = skip_trellis_based_on_satd[best_tx_type];

  // Point dqcoeff to the quantized coefficients corresponding to the best
  // transform type, then we can skip transform and quantization, e.g. in the
  // final pixel domain distortion calculation and recon_intra().
  p->dqcoeff = best_dqcoeff;

  if (calc_pixel_domain_distortion_final && best_eob) {
    best_rd_stats->dist = dist_block_px_domain(
        cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    best_rd_stats->sse = block_sse;
  }

  // Intra mode needs decoded pixels such that the next transform block
  // can use them for prediction.
  recon_intra(cpi, x, plane, block, blk_row, blk_col, plane_bsize, tx_size,
              txb_ctx, skip_trellis, best_tx_type, 0, &rate_cost, best_eob);
  p->dqcoeff = orig_dqcoeff;
}